

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

double perfetto::base::StrToD(char *nptr,char **endptr)

{
  double dVar1;
  
  if (StrToD(char_const*,char**)::c_locale == '\0') {
    StrToD();
  }
  dVar1 = strtod_l(nptr,endptr,(__locale_t)StrToD::c_locale);
  return dVar1;
}

Assistant:

double StrToD(const char* nptr, char** endptr) {
#if PERFETTO_BUILDFLAG(PERFETTO_OS_ANDROID) || \
    PERFETTO_BUILDFLAG(PERFETTO_OS_LINUX) ||   \
    PERFETTO_BUILDFLAG(PERFETTO_OS_APPLE)
  static auto c_locale = newlocale(LC_ALL, "C", nullptr);
  return strtod_l(nptr, endptr, c_locale);
#else
  return strtod(nptr, endptr);
#endif
}